

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID id;
  int iVar1;
  VariableID combined_module_id;
  SPIRFunction *caller;
  CombinedImageSampler *pCVar2;
  size_t sVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  bool bVar13;
  ID id_00;
  ID id_01;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  ulong uVar17;
  SPIRVariable *pSVar18;
  SPIRType *pSVar19;
  runtime_error *prVar20;
  _Elt_pointer ppSVar21;
  SPIRType *pSVar22;
  uint32_t *puVar23;
  undefined1 **args_1;
  CombinedImageSampler *pCVar24;
  VariableID sampler_id;
  VariableID image_id;
  long lVar25;
  long lVar26;
  Compiler *pCVar27;
  size_t sVar28;
  undefined1 **args_2;
  uint32_t result_type;
  uint32_t result_type_1;
  ID local_70;
  undefined1 local_6c [4];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  SmallVector<bool,_8UL> *local_48;
  SmallVector<unsigned_int,_8UL> *local_40;
  int local_34;
  
  uVar17 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_00337240:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    local_68[0] = (undefined1 *)CONCAT44(local_68[0]._4_4_,*args);
    pSVar19 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + *args
                        );
    iVar1 = *(int *)&(pSVar19->super_IVariant).field_0xc;
    if ((iVar1 != 0x12) && ((pSVar19->image).sampled != 1 || iVar1 != 0x10)) {
      return true;
    }
    uVar14 = args[1];
    uVar15 = args[2];
    pCVar27 = this->compiler;
    args_2 = (undefined1 **)local_6c;
    local_6c[0] = 1;
    args_1 = local_68;
LAB_003373c9:
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (pCVar27,uVar14,(char (*) [1])0x35713a,(uint *)args_1,(bool *)args_2);
    register_read(this->compiler,uVar14,uVar15,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar17 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar17 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      local_6c = (undefined1  [4])*args;
      pSVar19 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           (uint)local_6c);
      iVar1 = *(int *)&(pSVar19->super_IVariant).field_0xc;
      if (iVar1 == 0x12) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68[0] = local_58;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                   ,"");
        ::std::runtime_error::runtime_error(prVar20,(string *)local_68);
        *(undefined ***)prVar20 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar20,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (iVar1 != 0x10) {
        return true;
      }
      if ((pSVar19->image).sampled != 1) {
        return true;
      }
      uVar14 = args[1];
      uVar15 = args[2];
      pCVar27 = this->compiler;
      args_2 = local_68;
      local_68[0] = (undefined1 *)CONCAT71(local_68[0]._1_7_,1);
      args_1 = (undefined1 **)local_6c;
      goto LAB_003373c9;
    }
    if (uVar17 != 0x15) goto LAB_00337240;
    bVar13 = false;
  }
  else {
    pSVar18 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar18 == (SPIRVariable *)0x0) {
      return true;
    }
    pSVar19 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar18->super_IVariant).field_0xc);
    if (*(int *)&(pSVar19->super_IVariant).field_0xc != 0x10) {
      return true;
    }
    if ((pSVar19->image).sampled != 1) {
      return true;
    }
    if ((pSVar19->image).dim == DimBuffer) {
      return true;
    }
    bVar13 = true;
    if (this->compiler->dummy_sampler_id == 0) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68[0] = local_58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                 ,"");
      ::std::runtime_error::runtime_error(prVar20,(string *)local_68);
      *(undefined ***)prVar20 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar20,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ppSVar21 = (this->functions).c.
             super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar21 !=
      (this->functions).c.
      super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar21 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar21 = (this->functions).c.
                 super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar21[-1];
    if (caller->do_combined_parameters == true) {
      image_id.id = args[2];
      pSVar18 = maybe_get_backing_variable(this->compiler,image_id.id);
      if (pSVar18 != (SPIRVariable *)0x0) {
        image_id.id = (pSVar18->super_IVariant).self.id;
      }
      puVar23 = args + 3;
      if (bVar13) {
        puVar23 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar23;
      pSVar18 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar18 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar18->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar19 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *args);
      register_combined_image_sampler
                (this,caller,combined_module_id,image_id,sampler_id,(pSVar19->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar13) {
    pCVar27 = this->compiler;
    id_01.id = pCVar27->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
    pCVar27 = this->compiler;
  }
  pCVar2 = (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
           ptr;
  sVar3 = (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  lVar25 = (long)sVar3 >> 2;
  pCVar24 = pCVar2;
  sVar28 = sVar3;
  if (0 < lVar25) {
    lVar26 = lVar25 + 1;
    pCVar24 = pCVar2 + 2;
    do {
      if ((pCVar24[-2].image_id.id == id_00.id) && (pCVar24[-2].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + -2;
        goto LAB_003373fa;
      }
      if ((pCVar24[-1].image_id.id == id_00.id) && (pCVar24[-1].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + -1;
        goto LAB_003373fa;
      }
      if (((pCVar24->image_id).id == id_00.id) && ((pCVar24->sampler_id).id == id_01.id))
      goto LAB_003373fa;
      if ((pCVar24[1].image_id.id == id_00.id) && (pCVar24[1].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + 1;
        goto LAB_003373fa;
      }
      lVar26 = lVar26 + -1;
      pCVar24 = pCVar24 + 4;
    } while (1 < lVar26);
    sVar28 = ((long)(sVar3 * 0xc + lVar25 * -0x30) >> 2) * -0x5555555555555555;
    pCVar24 = pCVar2 + lVar25 * 4;
  }
  if (sVar28 == 1) {
LAB_0033734e:
    if (((pCVar24->image_id).id != id_00.id) || ((pCVar24->sampler_id).id != id_01.id))
    goto LAB_00337406;
  }
  else if (sVar28 == 2) {
LAB_0033733b:
    if (((pCVar24->image_id).id != id_00.id) || ((pCVar24->sampler_id).id != id_01.id)) {
      pCVar24 = pCVar24 + 1;
      goto LAB_0033734e;
    }
  }
  else {
    if (sVar28 != 3) goto LAB_00337406;
    if (((pCVar24->image_id).id != id_00.id) || ((pCVar24->sampler_id).id != id_01.id)) {
      pCVar24 = pCVar24 + 1;
      goto LAB_0033733b;
    }
  }
LAB_003373fa:
  if (pCVar24 != pCVar2 + sVar3) {
    return true;
  }
LAB_00337406:
  if (bVar13) {
    uVar14 = ParsedIR::increase_bound_by(&pCVar27->ir,1);
    pSVar19 = set<spirv_cross::SPIRType>(this->compiler,uVar14);
    pCVar27 = this->compiler;
    uVar15 = expression_type_id(pCVar27,args[2]);
    pSVar22 = Variant::get<spirv_cross::SPIRType>
                        ((pCVar27->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar15);
    (pSVar19->super_IVariant).self.id = (pSVar22->super_IVariant).self.id;
    uVar15 = pSVar22->vecsize;
    uVar16 = pSVar22->columns;
    *(undefined8 *)&(pSVar19->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar22->super_IVariant).field_0xc;
    pSVar19->vecsize = uVar15;
    pSVar19->columns = uVar16;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar19->array,&pSVar22->array);
    SmallVector<bool,_8UL>::operator=(&pSVar19->array_size_literal,&pSVar22->array_size_literal);
    bVar13 = pSVar22->pointer;
    bVar4 = pSVar22->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar22->field_0x7e;
    pSVar19->pointer_depth = pSVar22->pointer_depth;
    pSVar19->pointer = bVar13;
    pSVar19->forward_pointer = bVar4;
    *(undefined2 *)&pSVar19->field_0x7e = uVar5;
    pSVar19->storage = pSVar22->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar19->member_types,&pSVar22->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar19->member_type_index_redirection,&pSVar22->member_type_index_redirection);
    DVar6 = (pSVar22->image).dim;
    bVar13 = (pSVar22->image).depth;
    bVar4 = (pSVar22->image).arrayed;
    bVar7 = (pSVar22->image).ms;
    uVar8 = (pSVar22->image).field_0xb;
    uVar15 = (pSVar22->image).sampled;
    IVar9 = (pSVar22->image).format;
    AVar10 = (pSVar22->image).access;
    TVar11.id = (pSVar22->type_alias).id;
    TVar12.id = (pSVar22->parent_type).id;
    (pSVar19->image).type = (TypeID)(pSVar22->image).type.id;
    (pSVar19->image).dim = DVar6;
    (pSVar19->image).depth = bVar13;
    (pSVar19->image).arrayed = bVar4;
    (pSVar19->image).ms = bVar7;
    (pSVar19->image).field_0xb = uVar8;
    (pSVar19->image).sampled = uVar15;
    (pSVar19->image).format = IVar9;
    (pSVar19->image).access = AVar10;
    pSVar19->type_alias = (TypeID)TVar11.id;
    pSVar19->parent_type = (TypeID)TVar12.id;
    if (pSVar22 != pSVar19) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar19->member_name_cache,&(pSVar22->member_name_cache)._M_h);
    }
    (pSVar19->super_IVariant).self.id = uVar14;
    *(undefined4 *)&(pSVar19->super_IVariant).field_0xc = 0x11;
    (pSVar19->image).depth = false;
    local_70.id = 0;
  }
  else {
    uVar14 = *args;
    local_70.id = args[1];
  }
  uVar16 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
  local_68[0] = (undefined1 *)CONCAT44(local_68[0]._4_4_,uVar16);
  id.id = uVar16 + 1;
  pSVar19 = set<spirv_cross::SPIRType>(this->compiler,uVar16);
  pSVar22 = Variant::get<spirv_cross::SPIRType>
                      ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar14)
  ;
  (pSVar19->super_IVariant).self.id = (pSVar22->super_IVariant).self.id;
  uVar14 = pSVar22->vecsize;
  uVar15 = pSVar22->columns;
  *(undefined8 *)&(pSVar19->super_IVariant).field_0xc =
       *(undefined8 *)&(pSVar22->super_IVariant).field_0xc;
  pSVar19->vecsize = uVar14;
  pSVar19->columns = uVar15;
  local_40 = &pSVar19->array;
  SmallVector<unsigned_int,_8UL>::operator=(local_40,&pSVar22->array);
  local_48 = &pSVar19->array_size_literal;
  SmallVector<bool,_8UL>::operator=(local_48,&pSVar22->array_size_literal);
  bVar13 = pSVar22->pointer;
  bVar4 = pSVar22->forward_pointer;
  uVar5 = *(undefined2 *)&pSVar22->field_0x7e;
  pSVar19->pointer_depth = pSVar22->pointer_depth;
  pSVar19->pointer = bVar13;
  pSVar19->forward_pointer = bVar4;
  *(undefined2 *)&pSVar19->field_0x7e = uVar5;
  pSVar19->storage = pSVar22->storage;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
            (&pSVar19->member_types,&pSVar22->member_types);
  SmallVector<unsigned_int,_8UL>::operator=
            (&pSVar19->member_type_index_redirection,&pSVar22->member_type_index_redirection);
  DVar6 = (pSVar22->image).dim;
  bVar13 = (pSVar22->image).depth;
  bVar4 = (pSVar22->image).arrayed;
  bVar7 = (pSVar22->image).ms;
  uVar8 = (pSVar22->image).field_0xb;
  uVar14 = (pSVar22->image).sampled;
  IVar9 = (pSVar22->image).format;
  AVar10 = (pSVar22->image).access;
  TVar11.id = (pSVar22->type_alias).id;
  TVar12.id = (pSVar22->parent_type).id;
  (pSVar19->image).type = (TypeID)(pSVar22->image).type.id;
  (pSVar19->image).dim = DVar6;
  (pSVar19->image).depth = bVar13;
  (pSVar19->image).arrayed = bVar4;
  (pSVar19->image).ms = bVar7;
  (pSVar19->image).field_0xb = uVar8;
  (pSVar19->image).sampled = uVar14;
  (pSVar19->image).format = IVar9;
  (pSVar19->image).access = AVar10;
  pSVar19->type_alias = (TypeID)TVar11.id;
  pSVar19->parent_type = (TypeID)TVar12.id;
  if (pSVar22 != pSVar19) {
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pSVar19->member_name_cache,&(pSVar22->member_name_cache)._M_h);
  }
  pSVar19->pointer = true;
  pSVar19->storage = StorageClassUniformConstant;
  (pSVar19->parent_type).id = uVar16;
  local_6c = (undefined1  [4])0x0;
  local_34 = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,id.id,(uint *)local_68,(StorageClass *)local_6c,&local_34);
  if ((((id_01.id != 0) &&
       (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
       bVar13)) ||
      ((id_00.id != 0 &&
       (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
       bVar13)))) ||
     ((local_70.id != 0 &&
      (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,local_70,DecorationRelaxedPrecision),
      bVar13)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pSVar18 = maybe_get_backing_variable(this->compiler,id_00.id);
  if (pSVar18 != (SPIRVariable *)0x0) {
    pSVar19 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar18->super_IVariant).field_0xc);
    SmallVector<unsigned_int,_8UL>::operator=(local_40,&pSVar19->array);
    SmallVector<bool,_8UL>::operator=(local_48,&pSVar19->array_size_literal);
  }
  pCVar27 = this->compiler;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL>::reserve
            (&pCVar27->combined_image_samplers,
             (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
             buffer_size + 1);
  pCVar24 = (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
            ptr;
  sVar3 = (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  pCVar24[sVar3].combined_id.id = id.id;
  pCVar24[sVar3].image_id.id = id_00.id;
  pCVar24[sVar3].sampler_id.id = id_01.id;
  (pCVar27->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size
       = sVar3 + 1;
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}